

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# binary-reader-logging.cc
# Opt level: O3

Result __thiscall
wabt::BinaryReaderLogging::OnReloc
          (BinaryReaderLogging *this,RelocType type,Offset offset,Index index,uint32_t addend)

{
  Enum EVar1;
  
  WriteIndent(this);
  if ((int)type < 10) {
    Stream::Writef(this->stream_,"OnReloc(type: %s, offset: %zd, index: %u, addend: %d)\n",
                   *(undefined8 *)(g_reloc_type_name + (long)(int)type * 8),offset,(ulong)index,
                   addend);
    EVar1 = (*this->reader_->_vptr_BinaryReaderDelegate[0x98])
                      (this->reader_,(ulong)type,offset,(ulong)index,addend);
    return (Result)EVar1;
  }
  __assert_fail("static_cast<int>(reloc) < kRelocTypeCount",
                "/workspace/llm4binary/github/license_c_cmakelists/chakra-core[P]ChakraCore/lib/wabt/src/common.h"
                ,0x140,"const char *wabt::GetRelocTypeName(RelocType)");
}

Assistant:

Result BinaryReaderLogging::OnReloc(RelocType type,
                                    Offset offset,
                                    Index index,
                                    uint32_t addend) {
  int32_t signed_addend = static_cast<int32_t>(addend);
  LOGF("OnReloc(type: %s, offset: %" PRIzd ", index: %" PRIindex
       ", addend: %d)\n",
       GetRelocTypeName(type), offset, index, signed_addend);
  return reader_->OnReloc(type, offset, index, addend);
}